

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int renameUnmapSelectCb(Walker *pWalker,Select *p)

{
  int iVar1;
  Parse *pPVar2;
  ExprList *pEVar3;
  char *pcVar4;
  SrcList *pSVar5;
  Expr *pExpr;
  int iVar6;
  long lVar7;
  RenameToken *pRVar8;
  long lVar9;
  
  pPVar2 = pWalker->pParse;
  iVar6 = 2;
  if ((pPVar2->nErr == 0) && (iVar6 = 1, (p->selFlags & 0x4200000) == 0)) {
    pEVar3 = p->pEList;
    if ((pEVar3 != (ExprList *)0x0) && (iVar6 = pEVar3->nExpr, 0 < (long)iVar6)) {
      lVar7 = 0;
      do {
        pcVar4 = pEVar3->a[lVar7].zEName;
        if ((pcVar4 != (char *)0x0) && ((pEVar3->a[lVar7].fg.field_0x1 & 3) == 0)) {
          for (pRVar8 = pPVar2->pRename; pRVar8 != (RenameToken *)0x0; pRVar8 = pRVar8->pNext) {
            if ((char *)pRVar8->p == pcVar4) {
              pRVar8->p = (void *)0x0;
              break;
            }
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != iVar6);
    }
    pSVar5 = p->pSrc;
    if ((pSVar5 != (SrcList *)0x0) && (iVar6 = pSVar5->nSrc, 0 < iVar6)) {
      lVar7 = 0;
      do {
        pRVar8 = pPVar2->pRename;
        if (pRVar8 != (RenameToken *)0x0) {
          do {
            if ((char *)pRVar8->p == pSVar5->a[lVar7].zName) {
              pRVar8->p = (void *)0x0;
              break;
            }
            pRVar8 = pRVar8->pNext;
          } while (pRVar8 != (RenameToken *)0x0);
        }
        pExpr = (Expr *)pSVar5->a[lVar7].u3.pUsing;
        if ((pSVar5->a[lVar7].fg.field_0x2 & 8) == 0) {
          if (pExpr != (Expr *)0x0) {
            sqlite3WalkExprNN(pWalker,pExpr);
            iVar6 = pSVar5->nSrc;
          }
        }
        else {
          iVar1._0_1_ = pExpr->op;
          iVar1._1_1_ = pExpr->affExpr;
          iVar1._2_1_ = pExpr->op2;
          iVar1._3_1_ = pExpr->field_0x3;
          if (0 < (long)iVar1) {
            lVar9 = 0;
            do {
              pRVar8 = pPVar2->pRename;
              if (pRVar8 != (RenameToken *)0x0) {
                do {
                  if ((char *)pRVar8->p == (&pExpr->u)[lVar9].zToken) {
                    pRVar8->p = (void *)0x0;
                    break;
                  }
                  pRVar8 = pRVar8->pNext;
                } while (pRVar8 != (RenameToken *)0x0);
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 != iVar1);
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar6);
    }
    renameWalkWith(pWalker,(Select *)p->pWith);
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int renameUnmapSelectCb(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i;
  if( pParse->nErr ) return WRC_Abort;
  testcase( p->selFlags & SF_View );
  testcase( p->selFlags & SF_CopyCte );
  if( p->selFlags & (SF_View|SF_CopyCte) ){
    return WRC_Prune;
  }
  if( ALWAYS(p->pEList) ){
    ExprList *pList = p->pEList;
    for(i=0; i<pList->nExpr; i++){
      if( pList->a[i].zEName && pList->a[i].fg.eEName==ENAME_NAME ){
        sqlite3RenameTokenRemap(pParse, 0, (void*)pList->a[i].zEName);
      }
    }
  }
  if( ALWAYS(p->pSrc) ){  /* Every Select as a SrcList, even if it is empty */
    SrcList *pSrc = p->pSrc;
    for(i=0; i<pSrc->nSrc; i++){
      sqlite3RenameTokenRemap(pParse, 0, (void*)pSrc->a[i].zName);
      if( pSrc->a[i].fg.isUsing==0 ){
        sqlite3WalkExpr(pWalker, pSrc->a[i].u3.pOn);
      }else{
        unmapColumnIdlistNames(pParse, pSrc->a[i].u3.pUsing);
      }
    }
  }

  renameWalkWith(pWalker, p);
  return WRC_Continue;
}